

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

void __thiscall mjs::regexp::regexp(regexp *this,wstring_view pattern,regexp_flag flags)

{
  impl *this_00;
  regexp_flag in_R8D;
  wstring_view pattern_00;
  allocator<wchar_t> local_66;
  undefined1 local_65;
  regexp *local_58;
  size_t sStack_50;
  wregex local_48;
  regexp_flag local_24;
  regexp *prStack_20;
  regexp_flag flags_local;
  regexp *this_local;
  wstring_view pattern_local;
  
  pattern_local._M_len = (size_t)pattern._M_str;
  this_local = (regexp *)pattern._M_len;
  local_24 = flags;
  prStack_20 = this;
  this_00 = (impl *)operator_new(0x20);
  local_65 = 1;
  local_58 = this_local;
  sStack_50 = pattern_local._M_len;
  pattern_00._M_str._0_4_ = local_24;
  pattern_00._M_len = pattern_local._M_len;
  pattern_00._M_str._4_4_ = 0;
  (anonymous_namespace)::make_regex_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)this_local,pattern_00,in_R8D);
  impl::impl(this_00,&local_48);
  local_65 = 0;
  std::unique_ptr<mjs::regexp::impl,std::default_delete<mjs::regexp::impl>>::
  unique_ptr<std::default_delete<mjs::regexp::impl>,void>
            ((unique_ptr<mjs::regexp::impl,std::default_delete<mjs::regexp::impl>> *)this,this_00);
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex(&local_48);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->pattern_,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local,&local_66);
  std::allocator<wchar_t>::~allocator(&local_66);
  this->flags_ = local_24;
  return;
}

Assistant:

regexp::regexp(std::wstring_view pattern, regexp_flag flags)
    : impl_{new impl{make_regex(pattern, flags)}}
    , pattern_{pattern}
    , flags_{flags} {
}